

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR DSK_directorynamep(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  long lVar4;
  size_t x;
  long lVar5;
  DLword *pDVar6;
  LispPTR LVar7;
  long lStack_2030;
  char dirname [4096];
  char fullname [4096];
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    pLVar3 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar3 + 6) == 'D') {
      LVar7 = pLVar3[2] * 2;
      lStack_2030 = 5;
LAB_0011a950:
      if (0xffe < (ulong)((int)LVar7 + lStack_2030)) {
        *Lisp_errno = 200;
        goto LAB_0011a909;
      }
    }
    else {
      if (*(char *)((long)pLVar3 + 6) == 'C') {
        LVar7 = pLVar3[2];
        lStack_2030 = 3;
        goto LAB_0011a950;
      }
      error("LispStringLength: Not a character array.\n");
    }
    pLVar3 = NativeAligned4FromLAddr(*args);
    LVar7 = 0x1000;
    if ((int)pLVar3[2] < 0x1000) {
      LVar7 = pLVar3[2];
    }
    lVar4 = (long)(int)LVar7;
    if (*(char *)((long)pLVar3 + 6) == 'D') {
      pDVar6 = Lisp_world + (ulong)(ushort)pLVar3[1] + (ulong)(*pLVar3 & 0xfffffff);
      for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        dirname[lVar5] = *(char *)((ulong)pDVar6 ^ 2);
        pDVar6 = pDVar6 + 1;
      }
      dirname[lVar5] = '\0';
    }
    else if (*(char *)((long)pLVar3 + 6) == 'C') {
      uVar1 = *pLVar3;
      LVar7 = pLVar3[1];
      for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        dirname[lVar5] =
             *(char *)((long)Lisp_world +
                       lVar5 + (ulong)(ushort)LVar7 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      dirname[lVar4] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    LVar7 = 0;
    iVar2 = unixpathname(dirname,fullname,1,0);
    if (iVar2 != 0) {
      iVar2 = true_name(fullname);
      if (iVar2 == -1) {
        LVar7 = 0;
        iVar2 = lisppathname(fullname,dirname,1,0);
        if (iVar2 != 0) {
          x = strlen(dirname);
          pLVar3 = NativeAligned4FromLAddr(args[1]);
          pDVar6 = Lisp_world;
          uVar1 = *pLVar3;
          for (lVar4 = 0; x + 1 != lVar4; lVar4 = lVar4 + 1) {
            *(char *)((long)pDVar6 + lVar4 + (ulong)((uVar1 & 0xfffffff) * 2) ^ 3) = dirname[lVar4];
          }
          LVar7 = GetPosSmallp(x);
        }
      }
    }
  }
  else {
    *Lisp_errno = 100;
LAB_0011a909:
    LVar7 = 0;
  }
  return LVar7;
}

Assistant:

LispPTR DSK_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int fatp;
  char *base;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  separate_drive(dirname, drive);
  if (unixpathname(dirname, fullname, 1, 0, drive, 0, 0) == 0) return (NIL);
#else  /* DOS*/
  if (unixpathname(dirname, fullname, 1, 0) == 0) return (NIL);
#endif /* DOS */

  if (true_name(fullname) != -1) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}